

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::init_holder_helper
               (instance_type *inst,holder_type *holder_ptr,void *param_3)

{
  byte bVar1;
  
  if (holder_ptr == (holder_type *)0x0) {
    bVar1 = (inst->super_instance_essentials<CoreML::MilStoragePython::MilStoragePythonReader>).
            field_0x20;
    if ((bVar1 & 1) == 0) {
      return;
    }
    (inst->holder)._M_t.
    super___uniq_ptr_impl<CoreML::MilStoragePython::MilStoragePythonReader,_std::default_delete<CoreML::MilStoragePython::MilStoragePythonReader>_>
    ._M_t.
    super__Tuple_impl<0UL,_CoreML::MilStoragePython::MilStoragePythonReader_*,_std::default_delete<CoreML::MilStoragePython::MilStoragePythonReader>_>
    .super__Head_base<0UL,_CoreML::MilStoragePython::MilStoragePythonReader_*,_false>._M_head_impl =
         (inst->super_instance_essentials<CoreML::MilStoragePython::MilStoragePythonReader>).value;
  }
  else {
    (inst->holder)._M_t.
    super___uniq_ptr_impl<CoreML::MilStoragePython::MilStoragePythonReader,_std::default_delete<CoreML::MilStoragePython::MilStoragePythonReader>_>
    ._M_t.
    super__Tuple_impl<0UL,_CoreML::MilStoragePython::MilStoragePythonReader_*,_std::default_delete<CoreML::MilStoragePython::MilStoragePythonReader>_>
    .super__Head_base<0UL,_CoreML::MilStoragePython::MilStoragePythonReader_*,_false>._M_head_impl =
         (holder_ptr->_M_t).
         super___uniq_ptr_impl<CoreML::MilStoragePython::MilStoragePythonReader,_std::default_delete<CoreML::MilStoragePython::MilStoragePythonReader>_>
         ._M_t.
         super__Tuple_impl<0UL,_CoreML::MilStoragePython::MilStoragePythonReader_*,_std::default_delete<CoreML::MilStoragePython::MilStoragePythonReader>_>
         .super__Head_base<0UL,_CoreML::MilStoragePython::MilStoragePythonReader_*,_false>.
         _M_head_impl;
    (holder_ptr->_M_t).
    super___uniq_ptr_impl<CoreML::MilStoragePython::MilStoragePythonReader,_std::default_delete<CoreML::MilStoragePython::MilStoragePythonReader>_>
    ._M_t.
    super__Tuple_impl<0UL,_CoreML::MilStoragePython::MilStoragePythonReader_*,_std::default_delete<CoreML::MilStoragePython::MilStoragePythonReader>_>
    .super__Head_base<0UL,_CoreML::MilStoragePython::MilStoragePythonReader_*,_false>._M_head_impl =
         (MilStoragePythonReader *)0x0;
    bVar1 = (inst->super_instance_essentials<CoreML::MilStoragePython::MilStoragePythonReader>).
            field_0x20;
  }
  (inst->super_instance_essentials<CoreML::MilStoragePython::MilStoragePythonReader>).field_0x20 =
       bVar1 | 2;
  return;
}

Assistant:

static void init_holder_helper(instance_type *inst, const holder_type *holder_ptr, const void * /* dummy */) {
        if (holder_ptr) {
            init_holder_from_existing(inst, holder_ptr, std::is_copy_constructible<holder_type>());
            inst->holder_constructed = true;
        } else if (inst->owned || detail::always_construct_holder<holder_type>::value) {
            new (&inst->holder) holder_type(inst->value);
            inst->holder_constructed = true;
        }
    }